

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O0

vector<Quaternion,_std::allocator<Quaternion>_> * load_quaternion_cloud(string *filename)

{
  byte bVar1;
  ostream *poVar2;
  size_type sVar3;
  undefined8 in_RSI;
  vector<Quaternion,_std::allocator<Quaternion>_> *in_RDI;
  int i;
  int lines_loaded;
  Quaternion q;
  ifstream stream;
  vector<Quaternion,_std::allocator<Quaternion>_> *cloud;
  value_type *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  int local_258;
  double local_240 [4];
  undefined1 local_219;
  undefined1 local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,8);
  local_219 = 0;
  std::vector<Quaternion,_std::allocator<Quaternion>_>::vector
            ((vector<Quaternion,_std::allocator<Quaternion>_> *)0x106e72);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    for (local_258 = 0; local_258 < 4; local_258 = local_258 + 1) {
      std::istream::operator>>(local_218,local_240 + local_258);
    }
    std::vector<Quaternion,_std::allocator<Quaternion>_>::push_back
              ((vector<Quaternion,_std::allocator<Quaternion>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffd90),in_stack_fffffffffffffd88);
  }
  std::vector<Quaternion,_std::allocator<Quaternion>_>::pop_back
            ((vector<Quaternion,_std::allocator<Quaternion>_> *)0x106f25);
  poVar2 = std::operator<<((ostream *)&std::cout,"Loaded ");
  sVar3 = std::vector<Quaternion,_std::allocator<Quaternion>_>::size(in_RDI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," points!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_219 = 1;
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

vector<Quaternion> load_quaternion_cloud(const string filename)
{
    ifstream stream(filename); 
    vector<Quaternion> cloud;
    Quaternion q;
    int lines_loaded = 0;
    while (!stream.eof()) {
        for (int i = 0; i < 4; i++) stream >> q.p[i];
        cloud.push_back(q);
        lines_loaded += 1;
    }
    cloud.pop_back();
    cout << "Loaded " << cloud.size() << " points!" << endl;
    return cloud;
}